

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O0

void __thiscall QVariantAnimationPrivate::convertValues(QVariantAnimationPrivate *this,int t)

{
  long lVar1;
  QVariantAnimationPrivate *this_00;
  qsizetype qVar2;
  long in_RDI;
  long in_FS_OFFSET;
  QVariant *in_stack_00000010;
  KeyValue *pair;
  int i;
  QMetaType type;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  QMetaType *in_stack_ffffffffffffffb0;
  undefined4 local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMetaType::QMetaType(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  local_38 = 0;
  while( true ) {
    this_00 = (QVariantAnimationPrivate *)(long)local_38;
    qVar2 = QList<std::pair<double,_QVariant>_>::size
                      ((QList<std::pair<double,_QVariant>_> *)(in_RDI + 0x140));
    if (qVar2 <= (long)this_00) break;
    QList<std::pair<double,_QVariant>_>::operator[]
              ((QList<std::pair<double,_QVariant>_> *)this_00,
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    ::QVariant::convert(in_stack_00000010,type);
    local_38 = local_38 + 1;
  }
  ::QVariant::convert(in_stack_00000010,type);
  ::QVariant::convert(in_stack_00000010,type);
  updateInterpolator(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QVariantAnimationPrivate::convertValues(int t)
{
    auto type = QMetaType(t);
    //this ensures that all the keyValues are of type t
    for (int i = 0; i < keyValues.size(); ++i) {
        QVariantAnimation::KeyValue &pair = keyValues[i];
        pair.second.convert(type);
    }
    //we also need update to the current interval if needed
    currentInterval.start.second.convert(type);
    currentInterval.end.second.convert(type);

    //... and the interpolator
    updateInterpolator();
}